

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHClientRandomsMatch_Test::TestBody
          (SSLTest_ECHClientRandomsMatch_Test *this)

{
  int iVar1;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  Bytes local_b8;
  AssertionResult gtest_ar;
  uint8_t client_random1 [32];
  Bytes local_78;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<SSL_CTX> server_ctx;
  uint8_t client_random2 [32];
  UniquePtr<SSL_CTX> client_ctx;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&server_ctx,method);
  client_random2[8] = '\0';
  client_random2[9] = '\0';
  client_random2[10] = '\0';
  client_random2[0xb] = '\0';
  client_random2[0xc] = '\0';
  client_random2[0xd] = '\0';
  client_random2[0xe] = '\0';
  client_random2[0xf] = '\0';
  client_random2[0] =
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
       server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
      server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)client_random1,(internal *)client_random2,(AssertionResult *)"server_ctx",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x855,(char *)client_random1._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    std::__cxx11::string::~string((string *)client_random1);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(client_random2 + 8));
    goto LAB_0015d6e9;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(client_random2 + 8));
  MakeTestECHKeys((anon_unknown_0 *)&keys,'\x01');
  client_random2[8] = '\0';
  client_random2[9] = '\0';
  client_random2[10] = '\0';
  client_random2[0xb] = '\0';
  client_random2[0xc] = '\0';
  client_random2[0xd] = '\0';
  client_random2[0xe] = '\0';
  client_random2[0xf] = '\0';
  client_random2[0] =
       (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
       keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
      keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)client_random1,(internal *)client_random2,(AssertionResult *)0x2f7801,
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x857,(char *)client_random1._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar);
LAB_0015d4d3:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    std::__cxx11::string::~string((string *)client_random1);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(client_random2 + 8));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(client_random2 + 8));
    iVar1 = SSL_CTX_set1_ech_keys
                      ((SSL_CTX *)
                       server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (SSL_ECH_KEYS *)
                       keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
    client_random2[8] = '\0';
    client_random2[9] = '\0';
    client_random2[10] = '\0';
    client_random2[0xb] = '\0';
    client_random2[0xc] = '\0';
    client_random2[0xd] = '\0';
    client_random2[0xe] = '\0';
    client_random2[0xf] = '\0';
    client_random2[0] = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)client_random1,(internal *)client_random2,
                 (AssertionResult *)"SSL_CTX_set1_ech_keys(server_ctx.get(), keys.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x858,(char *)client_random1._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar);
      goto LAB_0015d4d3;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(client_random2 + 8));
    meth = (SSL_METHOD *)TLS_method();
    client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
    client_random2[8] = '\0';
    client_random2[9] = '\0';
    client_random2[10] = '\0';
    client_random2[0xb] = '\0';
    client_random2[0xc] = '\0';
    client_random2[0xd] = '\0';
    client_random2[0xe] = '\0';
    client_random2[0xf] = '\0';
    client_random2[0] =
         (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
         client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
    if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)client_random1,(internal *)client_random2,(AssertionResult *)"client_ctx"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x85b,(char *)client_random1._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      std::__cxx11::string::~string((string *)client_random1);
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(client_random2 + 8));
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(client_random2 + 8));
      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      client_random2[0] =
           CreateClientAndServer
                     (&client,&server,
                      (SSL_CTX *)
                      client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (SSL_CTX *)
                      server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      client_random2[8] = '\0';
      client_random2[9] = '\0';
      client_random2[10] = '\0';
      client_random2[0xb] = '\0';
      client_random2[0xc] = '\0';
      client_random2[0xd] = '\0';
      client_random2[0xe] = '\0';
      client_random2[0xf] = '\0';
      if ((bool)client_random2[0]) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(client_random2 + 8));
        client_random2[0] =
             InstallECHConfigList
                       ((SSL *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                        (SSL_ECH_KEYS *)
                        keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
        client_random2[8] = '\0';
        client_random2[9] = '\0';
        client_random2[10] = '\0';
        client_random2[0xb] = '\0';
        client_random2[0xc] = '\0';
        client_random2[0xd] = '\0';
        client_random2[0xe] = '\0';
        client_random2[0xf] = '\0';
        if (!(bool)client_random2[0]) {
          testing::Message::Message((Message *)&gtest_ar);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)client_random1,(internal *)client_random2,
                     (AssertionResult *)"InstallECHConfigList(client.get(), keys.get())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x85f,(char *)client_random1._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar)
          ;
          goto LAB_0015d694;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(client_random2 + 8));
        client_random2[0] =
             CompleteHandshakes((SSL *)client._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                (SSL *)server._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        client_random2[8] = '\0';
        client_random2[9] = '\0';
        client_random2[10] = '\0';
        client_random2[0xb] = '\0';
        client_random2[0xc] = '\0';
        client_random2[0xd] = '\0';
        client_random2[0xe] = '\0';
        client_random2[0xf] = '\0';
        if (!(bool)client_random2[0]) {
          testing::Message::Message((Message *)&gtest_ar);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)client_random1,(internal *)client_random2,
                     (AssertionResult *)"CompleteHandshakes(client.get(), server.get())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x860,(char *)client_random1._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar)
          ;
          goto LAB_0015d694;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(client_random2 + 8));
        iVar1 = SSL_ech_accepted((SSL *)client._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        client_random2[8] = '\0';
        client_random2[9] = '\0';
        client_random2[10] = '\0';
        client_random2[0xb] = '\0';
        client_random2[0xc] = '\0';
        client_random2[0xd] = '\0';
        client_random2[0xe] = '\0';
        client_random2[0xf] = '\0';
        client_random2[0] = iVar1 != 0;
        if (!(bool)client_random2[0]) {
          testing::Message::Message((Message *)&gtest_ar);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)client_random1,(internal *)client_random2,
                     (AssertionResult *)"SSL_ech_accepted(client.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x862,(char *)client_random1._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          std::__cxx11::string::~string((string *)client_random1);
          if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(client_random2 + 8));
        iVar1 = SSL_ech_accepted((SSL *)server._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        client_random2[8] = '\0';
        client_random2[9] = '\0';
        client_random2[10] = '\0';
        client_random2[0xb] = '\0';
        client_random2[0xc] = '\0';
        client_random2[0xd] = '\0';
        client_random2[0xe] = '\0';
        client_random2[0xf] = '\0';
        client_random2[0] = iVar1 != 0;
        if (!(bool)client_random2[0]) {
          testing::Message::Message((Message *)&gtest_ar);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)client_random1,(internal *)client_random2,
                     (AssertionResult *)"SSL_ech_accepted(server.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x863,(char *)client_random1._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          std::__cxx11::string::~string((string *)client_random1);
          if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(client_random2 + 8));
        local_b8.span_.data_ = &DAT_00000020;
        local_78.span_.data_ =
             (uchar *)SSL_get_client_random
                                ((SSL *)client._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                 client_random1,0x20);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"sizeof(client_random1)",
                   "SSL_get_client_random(client.get(), client_random1, sizeof(client_random1))",
                   (unsigned_long *)&local_b8,(unsigned_long *)&local_78);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x86c,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_b8)
          ;
LAB_0015d78a:
          this_00 = &gtest_ar.message_;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
          if ((long *)local_b8.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_b8.span_.data_ + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          local_b8.span_.data_ = &DAT_00000020;
          local_78.span_.data_ =
               (uchar *)SSL_get_client_random
                                  ((SSL *)server._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                   client_random2,0x20);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar,"sizeof(client_random2)",
                     "SSL_get_client_random(server.get(), client_random2, sizeof(client_random2))",
                     (unsigned_long *)&local_b8,(unsigned_long *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_b8);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x86f,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)&local_b8);
            goto LAB_0015d78a;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          local_b8.span_.size_ = 0x20;
          local_78.span_.size_ = 0x20;
          local_b8.span_.data_ = client_random1;
          local_78.span_.data_ = client_random2;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar,"Bytes(client_random1)","Bytes(client_random2)",&local_b8
                     ,&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_b8);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x870,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
            if ((long *)local_b8.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_b8.span_.data_ + 8))();
            }
          }
          this_00 = &gtest_ar.message_;
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)client_random1,(internal *)client_random2,
                   (AssertionResult *)
                   "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x85e,(char *)client_random1._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&gtest_ar);
LAB_0015d694:
        this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(client_random2 + 8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        std::__cxx11::string::~string((string *)client_random1);
        if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
  }
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
LAB_0015d6e9:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
  return;
}

Assistant:

TEST(SSLTest, ECHClientRandomsMatch) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys();
  ASSERT_TRUE(keys);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys.get()));
  ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));

  EXPECT_TRUE(SSL_ech_accepted(client.get()));
  EXPECT_TRUE(SSL_ech_accepted(server.get()));

  // An ECH server will fairly naturally record the inner ClientHello random,
  // but an ECH client may forget to update the random once ClientHelloInner is
  // selected.
  uint8_t client_random1[SSL3_RANDOM_SIZE];
  uint8_t client_random2[SSL3_RANDOM_SIZE];
  ASSERT_EQ(sizeof(client_random1),
            SSL_get_client_random(client.get(), client_random1,
                                  sizeof(client_random1)));
  ASSERT_EQ(sizeof(client_random2),
            SSL_get_client_random(server.get(), client_random2,
                                  sizeof(client_random2)));
  EXPECT_EQ(Bytes(client_random1), Bytes(client_random2));
}